

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O2

void __thiscall QDtlsPrivateOpenSSL::storePeerCertificates(QDtlsPrivateOpenSSL *this)

{
  QSslConfiguration *pQVar1;
  char cVar2;
  X509 *x509;
  stack_st_X509 *x509_00;
  long in_FS_OFFSET;
  QSslCertificate peerCertificate;
  QArrayDataPointer<QSslCertificate> local_70;
  QArrayDataPointer<QSslCertificate> local_58;
  QSslCertificate local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  x509 = q_SSL_get1_peer_certificate((this->dtls).tlsConnection.value.ptr);
  local_38.d.d.ptr =
       (QExplicitlySharedDataPointer<QSslCertificatePrivate>)
       (totally_ordered_wrapper<QSslCertificatePrivate_*>)0xaaaaaaaaaaaaaaaa;
  QTlsPrivate::X509CertificateOpenSSL::certificateFromX509
            ((X509CertificateOpenSSL *)&stack0xffffffffffffffc8,x509);
  pQVar1 = &(this->super_QDtlsBasePrivate).dtlsConfiguration;
  QTlsBackend::storePeerCertificate(pQVar1,&stack0xffffffffffffffc8);
  q_X509_free(x509);
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (QSslCertificate *)0xaaaaaaaaaaaaaaaa;
  QSslConfiguration::peerCertificateChain();
  if (local_58.size == 0) {
    x509_00 = q_SSL_get_peer_cert_chain((this->dtls).tlsConnection.value.ptr);
    QTlsPrivate::X509CertificateOpenSSL::stackOfX509ToQSslCertificates
              ((QList<QSslCertificate> *)&local_70,x509_00);
    QArrayDataPointer<QSslCertificate>::operator=(&local_58,&local_70);
    QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_70);
    cVar2 = QSslCertificate::isNull();
    if ((cVar2 == '\0') && ((this->super_QDtlsBasePrivate).mode == SslServerMode)) {
      QList<QSslCertificate>::emplaceFront<QSslCertificate_const&>
                ((QList<QSslCertificate> *)&local_58,&stack0xffffffffffffffc8);
    }
    QTlsBackend::storePeerCertificateChain(pQVar1,(QList *)&local_58);
  }
  QArrayDataPointer<QSslCertificate>::~QArrayDataPointer(&local_58);
  QSslCertificate::~QSslCertificate(&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDtlsPrivateOpenSSL::storePeerCertificates()
{
    Q_ASSERT(dtls.tlsConnection.data());
    // Store the peer certificate and chain. For clients, the peer certificate
    // chain includes the peer certificate; for servers, it doesn't. Both the
    // peer certificate and the chain may be empty if the peer didn't present
    // any certificate.
    X509 *x509 = q_SSL_get_peer_certificate(dtls.tlsConnection.data());
    const auto peerCertificate = QTlsPrivate::X509CertificateOpenSSL::certificateFromX509(x509);
    QTlsBackend::storePeerCertificate(dtlsConfiguration, peerCertificate);
    q_X509_free(x509);

    auto peerCertificateChain = dtlsConfiguration.peerCertificateChain();
    if (peerCertificateChain.isEmpty()) {
        auto stack = q_SSL_get_peer_cert_chain(dtls.tlsConnection.data());
        peerCertificateChain = QTlsPrivate::X509CertificateOpenSSL::stackOfX509ToQSslCertificates(stack);
        if (!peerCertificate.isNull() && mode == QSslSocket::SslServerMode)
            peerCertificateChain.prepend(peerCertificate);
        QTlsBackend::storePeerCertificateChain(dtlsConfiguration, peerCertificateChain);
    }
}